

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

int __thiscall httplib::ThreadPool::shutdown(ThreadPool *this,int __fd,int __how)

{
  bool bVar1;
  undefined7 extraout_var;
  thread *t;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  unique_lock<std::mutex> lock;
  ThreadPool *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&__range2,&this->mutex_);
  this->shutdown_ = true;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__range2);
  std::condition_variable::notify_all();
  __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->threads_);
  t = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->threads_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&t);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void shutdown() override {
            // Stop all worker threads...
            {
                std::unique_lock<std::mutex> lock(mutex_);
                shutdown_ = true;
            }

            cond_.notify_all();

            // Join...
            for (auto& t : threads_) {
                t.join();
            }
        }